

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phitsmcpl.c
# Opt level: O3

int mcpl2phits_app(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int nopolarisation;
  int use64bitreclen;
  uint64_t nparticles_limit;
  char *outphitsfile;
  char *inmcplfile;
  int local_20;
  int local_1c;
  uint64_t local_18;
  char *local_10;
  char *local_8;
  
  iVar1 = mcpl2phits_parse_args(argc,argv,&local_8,&local_10,&local_18,&local_1c,&local_20);
  iVar2 = 0;
  if ((iVar1 != -1) && (iVar2 = iVar1, iVar1 == 0)) {
    mcpl2phits(local_8,local_10,(uint)(local_20 == 0),local_18,(uint)(local_1c != 0) * 4 + 4);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mcpl2phits_app( int argc, char** argv ) {

  const char * inmcplfile;
  const char * outphitsfile;
  uint64_t nparticles_limit;
  int use64bitreclen, nopolarisation;

  int parse = mcpl2phits_parse_args( argc, (const char**)argv, &inmcplfile,
                                     &outphitsfile, &nparticles_limit,
                                     &use64bitreclen, &nopolarisation);

  if (parse==-1)// --help
    return 0;

  if (parse)// parse error
    return parse;

  int reclen = (use64bitreclen?8:4);

  if ( mcpl2phits( inmcplfile, outphitsfile, (nopolarisation?0:1),
                   nparticles_limit, reclen) )
    return 0;

  return 1;
}